

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg_buffer.h
# Opt level: O0

void __thiscall spdlog::details::log_msg_buffer::~log_msg_buffer(log_msg_buffer *this)

{
  ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)this);
  return;
}

Assistant:

class SPDLOG_API log_msg_buffer : public log_msg {
    memory_buf_t buffer;
    void update_string_views();

public:
    log_msg_buffer() = default;
    explicit log_msg_buffer(const log_msg &orig_msg);
    log_msg_buffer(const log_msg_buffer &other);
    log_msg_buffer(log_msg_buffer &&other) SPDLOG_NOEXCEPT;
    log_msg_buffer &operator=(const log_msg_buffer &other);
    log_msg_buffer &operator=(log_msg_buffer &&other) SPDLOG_NOEXCEPT;
}